

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O2

void google::protobuf::anon_unknown_21::ValidateFeatureLifetimesImpl
               (Edition edition,Message *message,ValidationResults *results)

{
  ushort uVar1;
  FieldDescriptor *this;
  char *pcVar2;
  pointer ppFVar3;
  int number;
  Message *message_00;
  EnumDescriptor *pEVar4;
  EnumValueDescriptor *pEVar5;
  undefined1 *puVar6;
  ValidationResults *in_R9;
  pointer ppFVar7;
  string_view full_name;
  string_view full_name_00;
  Metadata MVar8;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_128;
  AlphaNum local_110;
  AlphaNum local_e0;
  string_view local_b0 [3];
  string local_80;
  AlphaNum local_60;
  
  local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MVar8 = Message::GetMetadata(message);
  Reflection::ListFields
            (MVar8.reflection,message,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)&local_128);
  ppFVar3 = local_128._M_impl.super__Vector_impl_data._M_finish;
  ppFVar7 = local_128._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppFVar7 == ppFVar3) {
      std::
      _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~_Vector_base(&local_128);
      return;
    }
    this = *ppFVar7;
    if (((this->field_0x1 & 8) == 0) ||
       (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this->type_ * 4) != 10)) {
      pEVar4 = FieldDescriptor::enum_type(this);
      if (pEVar4 != (EnumDescriptor *)0x0) {
        MVar8 = Message::GetMetadata(message);
        number = Reflection::GetEnumValue(MVar8.reflection,message,this);
        pEVar4 = FieldDescriptor::enum_type(this);
        pEVar5 = EnumDescriptor::FindValueByNumber(pEVar4,number);
        if (pEVar5 == (EnumValueDescriptor *)0x0) {
          local_b0[0] = absl::lts_20250127::NullSafeStringView("Feature ");
          local_e0.piece_._M_str = (this->all_names_).payload_;
          local_e0.piece_._M_len = (size_t)*(ushort *)(local_e0.piece_._M_str + 2);
          local_e0.piece_._M_str = local_e0.piece_._M_str + ~local_e0.piece_._M_len;
          local_110.piece_ = absl::lts_20250127::NullSafeStringView(" has no known value ");
          absl::lts_20250127::AlphaNum::AlphaNum(&local_60,number);
          absl::lts_20250127::StrCat_abi_cxx11_
                    (&local_80,(lts_20250127 *)local_b0,&local_e0,&local_110,&local_60,
                     (AlphaNum *)in_R9);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                     &local_80);
          std::__cxx11::string::~string((string *)&local_80);
          goto LAB_0034597b;
        }
        puVar6 = (undefined1 *)(pEVar5->options_->field_0)._impl_.feature_support_;
        if ((FieldOptions_FeatureSupport *)puVar6 == (FieldOptions_FeatureSupport *)0x0) {
          puVar6 = _FieldOptions_FeatureSupport_default_instance_;
        }
        full_name._M_str = puVar6;
        full_name._M_len = (size_t)pEVar5->all_names_[1]._M_dataplus._M_p;
        ValidateSingleFeatureLifetimes
                  ((anon_unknown_21 *)(ulong)edition,(Edition)pEVar5->all_names_[1]._M_string_length
                   ,full_name,(FeatureSupport *)results,in_R9);
      }
      puVar6 = (undefined1 *)(this->options_->field_0)._impl_.feature_support_;
      if ((FieldOptions_FeatureSupport *)puVar6 == (FieldOptions_FeatureSupport *)0x0) {
        puVar6 = _FieldOptions_FeatureSupport_default_instance_;
      }
      pcVar2 = (this->all_names_).payload_;
      uVar1 = *(ushort *)(pcVar2 + 2);
      full_name_00._M_len = pcVar2 + ~(ulong)uVar1;
      full_name_00._M_str = puVar6;
      ValidateSingleFeatureLifetimes
                ((anon_unknown_21 *)(ulong)edition,(uint)uVar1,full_name_00,
                 (FeatureSupport *)results,in_R9);
    }
    else {
      MVar8 = Message::GetMetadata(message);
      message_00 = Reflection::GetMessage(MVar8.reflection,message,this,(MessageFactory *)0x0);
      ValidateFeatureLifetimesImpl(edition,message_00,results);
    }
LAB_0034597b:
    ppFVar7 = ppFVar7 + 1;
  } while( true );
}

Assistant:

void ValidateFeatureLifetimesImpl(Edition edition, const Message& message,
                                  FeatureResolver::ValidationResults& results) {
  std::vector<const FieldDescriptor*> fields;
  message.GetReflection()->ListFields(message, &fields);
  for (const FieldDescriptor* field : fields) {
    // Recurse into message extension.
    if (field->is_extension() &&
        field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      ValidateFeatureLifetimesImpl(
          edition, message.GetReflection()->GetMessage(message, field),
          results);
      continue;
    }

    if (field->enum_type() != nullptr) {
      int number = message.GetReflection()->GetEnumValue(message, field);
      auto value = field->enum_type()->FindValueByNumber(number);
      if (value == nullptr) {
        results.errors.emplace_back(absl::StrCat(
            "Feature ", field->full_name(), " has no known value ", number));
        continue;
      }
      ValidateSingleFeatureLifetimes(edition, value->full_name(),
                                     value->options().feature_support(),
                                     results);
    }

    ValidateSingleFeatureLifetimes(edition, field->full_name(),
                                   field->options().feature_support(), results);
  }
}